

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int bbSPIXfer(uint CS,char *inBuf,char *outBuf,uint count)

{
  int iVar1;
  uint8_t uVar2;
  char *pcVar3;
  char *pcVar4;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  wfRx_t *w;
  int pos;
  int SCLK;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff84;
  char in_stack_ffffffffffffff8f;
  wfRx_t *in_stack_ffffffffffffff90;
  FILE *pFVar5;
  uint local_24;
  uint local_4;
  
  pFVar5 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar3 = myTimeStamp();
    pcVar4 = myBuf2Str(in_stack_ffffffffffffff84,
                       (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    fprintf(pFVar5,"%s %s: CS=%d inBuf=%s outBuf=%08X count=%d\n",pcVar3,"bbSPIXfer",(ulong)in_EDI,
            pcVar4,(int)in_RDX,in_ECX);
  }
  pFVar5 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar3 = myTimeStamp();
      fprintf(pFVar5,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar3,"bbSPIXfer");
    }
    local_4 = 0xffffffe1;
  }
  else if (in_EDI < 0x20) {
    if (wfRx[in_EDI].mode == 7) {
      if ((in_RSI == 0) || (in_ECX == 0)) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar3 = myTimeStamp();
          fprintf(pFVar5,"%s %s: input buffer can\'t be NULL\n",pcVar3,"bbSPIXfer");
        }
        local_4 = 0xffffffa6;
      }
      else if ((in_RDX == 0) && (in_ECX != 0)) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar3 = myTimeStamp();
          fprintf(pFVar5,"%s %s: output buffer can\'t be NULL\n",pcVar3,"bbSPIXfer");
        }
        local_4 = 0xffffffa6;
      }
      else {
        iVar1 = wfRx[in_EDI].field_4.s.readPos;
        wfRx[iVar1].field_4.I.SDA = in_EDI;
        wfRx[iVar1].baud = wfRx[in_EDI].baud;
        wfRx[iVar1].field_4.s.fullBit = wfRx[in_EDI].field_4.s.fullBit;
        wfRx[iVar1].field_4.s.halfBit = wfRx[in_EDI].field_4.s.halfBit;
        wfRx_lock(0);
        bbSPIStart((wfRx_t *)0x11ebaf);
        for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
          uVar2 = bbSPIXferByte(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
          *(uint8_t *)(in_RDX + (int)local_24) = uVar2;
        }
        bbSPIStop((wfRx_t *)0x11ebff);
        wfRx_unlock(0);
        local_4 = in_ECX;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar3 = myTimeStamp();
        fprintf(pFVar5,"%s %s: no SPI on gpio (%d)\n",pcVar3,"bbSPIXfer",(ulong)in_EDI);
      }
      local_4 = 0xffffff72;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar3 = myTimeStamp();
      fprintf(pFVar5,"%s %s: bad gpio (%d)\n",pcVar3,"bbSPIXfer",(ulong)in_EDI);
    }
    local_4 = 0xfffffffe;
  }
  return local_4;
}

Assistant:

int bbSPIXfer(
   unsigned CS,
   char *inBuf,
   char *outBuf,
   unsigned count)
{
   int SCLK;
   int pos;
   wfRx_t *w;

   DBG(DBG_USER, "CS=%d inBuf=%s outBuf=%08X count=%d",
      CS, myBuf2Str(count, (char *)inBuf), (int)outBuf, count);

   CHECK_INITED;

   if (CS > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", CS);

   if (wfRx[CS].mode != PI_WFRX_SPI_CS)
      SOFT_ERROR(PI_NOT_SPI_GPIO, "no SPI on gpio (%d)", CS);

   if (!inBuf || !count)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && count)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   SCLK = wfRx[CS].S.SCLK;

   wfRx[SCLK].S.CS = CS;
   wfRx[SCLK].baud = wfRx[CS].baud;
   wfRx[SCLK].S.delay = wfRx[CS].S.delay;
   wfRx[SCLK].S.spiFlags = wfRx[CS].S.spiFlags;

   w = &wfRx[SCLK];

   wfRx_lock(SCLK);

   bbSPIStart(w);
     
   for (pos=0; pos < count; pos++)
   {
      outBuf[pos] = bbSPIXferByte(w, inBuf[pos]);
   }

   bbSPIStop(w);

   wfRx_unlock(SCLK);

   return count;
}